

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall QDateTimeEditPrivate::syncCalendarWidget(QDateTimeEditPrivate *this)

{
  QDateTimeEdit *this_00;
  QCalendarPopup *pQVar1;
  QDate QVar2;
  QDate max;
  long in_FS_OFFSET;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->monthCalendar != (QCalendarPopup *)0x0) {
    this_00 = *(QDateTimeEdit **)
               &(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate.field_0x8;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QSignalBlocker::QSignalBlocker((QSignalBlocker *)local_48,(QObject *)this->monthCalendar);
    pQVar1 = this->monthCalendar;
    QVar2 = QDateTimeEdit::minimumDate(this_00);
    max = QDateTimeEdit::maximumDate(this_00);
    QCalendarPopup::setDateRange(pQVar1,QVar2,max);
    pQVar1 = this->monthCalendar;
    QVar2 = QDateTimeEdit::date(this_00);
    QCalendarPopup::setDate(pQVar1,QVar2);
    QSignalBlocker::~QSignalBlocker((QSignalBlocker *)local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEditPrivate::syncCalendarWidget()
{
    Q_Q(QDateTimeEdit);
    if (monthCalendar) {
        const QSignalBlocker blocker(monthCalendar);
        monthCalendar->setDateRange(q->minimumDate(), q->maximumDate());
        monthCalendar->setDate(q->date());
    }
}